

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerResults::GenerateExportFile
          (SimpleParallelAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulonglong uVar5;
  ostream *poVar6;
  ulong uVar7;
  uchar *puVar8;
  bool bVar9;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  char local_308 [8];
  char number_str [128];
  char time_str [128];
  Frame frame;
  ulonglong local_1f8;
  uint local_1dc;
  U32 i;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  void *f;
  stringstream ss;
  ostream local_198 [376];
  U32 local_20;
  DisplayBase local_1c;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  SimpleParallelAnalyzerResults *this_local;
  
  local_20 = export_type_user_id;
  local_1c = display_base;
  _export_type_user_id_local = file;
  file_local = (char *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&f);
  pvVar4 = (void *)AnalyzerHelpers::StartFile(_export_type_user_id_local,false);
  uVar5 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar6 = std::operator<<(local_198,"Time [s],Value");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  uVar7 = AnalyzerResults::GetNumFrames();
  for (local_1dc = 0; local_1dc < uVar7; local_1dc = local_1dc + 1) {
    AnalyzerResults::GetFrame((ulonglong)(time_str + 0x78));
    AnalyzerHelpers::GetTimeString(time_str._120_8_,uVar5,uVar2,number_str + 0x78,0x80);
    AnalyzerHelpers::GetNumberString(local_1f8,local_1c,0x10,local_308,0x80);
    poVar6 = std::operator<<(local_198,number_str + 0x78);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = std::operator<<(poVar6,local_308);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    puVar8 = (uchar *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    uVar3 = std::__cxx11::string::length();
    AnalyzerHelpers::AppendToFile(puVar8,uVar3,pvVar4);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::string(local_368);
    std::__cxx11::stringstream::str((string *)&f);
    std::__cxx11::string::~string(local_368);
    bVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)local_1dc)
    ;
    bVar9 = (bVar1 & 1) == 1;
    if (bVar9) {
      AnalyzerHelpers::EndFile(pvVar4);
    }
    Frame::~Frame((Frame *)(time_str + 0x78));
    if (bVar9) goto LAB_0010f103;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
  AnalyzerHelpers::EndFile(pvVar4);
LAB_0010f103:
  std::__cxx11::stringstream::~stringstream((stringstream *)&f);
  return;
}

Assistant:

void SimpleParallelAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
	std::stringstream ss;
	void* f = AnalyzerHelpers::StartFile( file );

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	ss << "Time [s],Value" << std::endl;

	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );
		
		char time_str[128];
		AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

		char number_str[128];
		AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );

		ss << time_str << "," << number_str << std::endl;

		AnalyzerHelpers::AppendToFile( (U8*)ss.str().c_str(), (U32)ss.str().length(), f );
		ss.str( std::string() );
							
		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			AnalyzerHelpers::EndFile( f );
			return;
		}
	}

	UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
	AnalyzerHelpers::EndFile( f );
}